

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintExtensionsInDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  long lVar1;
  long lVar2;
  string local_50;
  
  local_50.field_2._M_allocated_capacity = 0x6f69736e65747865;
  local_50.field_2._8_2_ = 0x736e;
  local_50._M_string_length = 10;
  local_50.field_2._M_local_buf[10] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  io::Printer::Print(this->printer_,"$list$=[\n","list",&local_50);
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(message_descriptor + 0x68)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      PrintFieldDescriptor
                (this,(FieldDescriptor *)(*(long *)(message_descriptor + 0x70) + lVar2),true);
      io::Printer::Print(this->printer_,",\n");
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x78;
    } while (lVar1 < *(int *)(message_descriptor + 0x68));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::PrintExtensionsInDescriptor(
    const Descriptor& message_descriptor) const {
  const bool is_extension = true;
  PrintFieldDescriptorsInDescriptor(
      message_descriptor, is_extension, "extensions",
      &Descriptor::extension_count, &Descriptor::extension);
}